

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::Extension::SerializeMessageSetItemWithCachedSizes
          (Extension *this,int number,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int number_local;
  Extension *this_local;
  
  if ((this->type == '\v') && ((this->is_repeated & 1U) == 0)) {
    if ((this->field_0xa & 1) == 0) {
      io::CodedOutputStream::WriteTag(output,0xb);
      WireFormatLite::WriteUInt32(2,number,output);
      if (((byte)this->field_0xa >> 4 & 1) == 0) {
        WireFormatLite::WriteMessageMaybeToArray(3,(this->field_0).message_value,output);
      }
      else {
        (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_ +
                    0x78))((this->field_0).repeated_string_value,3,output);
      }
      io::CodedOutputStream::WriteTag(output,0xc);
    }
  }
  else {
    SerializeFieldWithCachedSizes(this,number,output);
  }
  return;
}

Assistant:

void ExtensionSet::Extension::SerializeMessageSetItemWithCachedSizes(
    int number,
    io::CodedOutputStream* output) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    SerializeFieldWithCachedSizes(number, output);
    return;
  }

  if (is_cleared) return;

  // Start group.
  output->WriteTag(WireFormatLite::kMessageSetItemStartTag);

  // Write type ID.
  WireFormatLite::WriteUInt32(WireFormatLite::kMessageSetTypeIdNumber,
                              number,
                              output);
  // Write message.
  if (is_lazy) {
    lazymessage_value->WriteMessage(
        WireFormatLite::kMessageSetMessageNumber, output);
  } else {
    WireFormatLite::WriteMessageMaybeToArray(
        WireFormatLite::kMessageSetMessageNumber,
        *message_value,
        output);
  }

  // End group.
  output->WriteTag(WireFormatLite::kMessageSetItemEndTag);
}